

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O0

int __thiscall QLocalServerPrivate::listen(QLocalServerPrivate *this,int __fd,int __n)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QLatin1StringView latin1_06;
  bool bVar1;
  Int IVar2;
  int iVar3;
  QObject *pQVar4;
  parameter_type pQVar5;
  ulong uVar6;
  qsizetype qVar7;
  int *piVar8;
  char *pcVar9;
  char *__new;
  QSocketNotifier *this_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringBuilder<char16_t,_const_QString_&> QVar10;
  mode_t mode;
  socklen_t addrSize;
  uint extraCharacters;
  QLocalServer *q;
  QFileInfo serverNameFileInfo;
  QByteArray encodedFullServerName;
  QByteArray encodedTempPath;
  SocketOptions options;
  optional<QTemporaryDir> tempDir;
  sockaddr_un addr;
  QFlagsStorage<QLocalServer::SocketOption> in_stack_fffffffffffffc28;
  SocketOption in_stack_fffffffffffffc2c;
  QLocalServerPrivate *in_stack_fffffffffffffc30;
  QString *in_stack_fffffffffffffc38;
  QString *in_stack_fffffffffffffc40;
  QStringBuilder<char16_t,_const_QString_&> *in_stack_fffffffffffffc58;
  QLocalServerPrivate *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  uint local_35c;
  socklen_t local_324;
  undefined1 local_2c1;
  Connection local_2c0 [7];
  QFlagsStorageHelper<QLocalServer::SocketOption,_4> local_288;
  QFlagsStorageHelper<QLocalServer::SocketOption,_4> local_284;
  QFlagsStorageHelper<QLocalServer::SocketOption,_4> local_280;
  QFlagsStorageHelper<QLocalServer::SocketOption,_4> local_27c;
  QFlagsStorageHelper<QLocalServer::SocketOption,_4> local_22c;
  QLatin1StringView local_1f8;
  undefined2 local_15a;
  undefined8 local_140;
  QFlagsStorageHelper<QLocalServer::SocketOption,_4> local_134;
  QByteArray local_130;
  QByteArray local_118;
  undefined2 local_fa;
  char16_t local_f8;
  QString *local_f0;
  undefined1 local_d0 [30];
  QChar local_b2;
  Int local_b0;
  QFlagsStorageHelper<QLocalServer::SocketOption,_4> local_ac;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_76 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = &q_func(this)->super_QObject;
  local_ac.super_QFlagsStorage<QLocalServer::SocketOption>.i =
       (QFlagsStorage<QLocalServer::SocketOption>)0xaaaaaaaa;
  pQVar5 = QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
           ::value((QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
                    *)in_stack_fffffffffffffc30);
  local_b0 = (pQVar5->super_QFlagsStorageHelper<QLocalServer::SocketOption,_4>).
             super_QFlagsStorage<QLocalServer::SocketOption>.i;
  local_ac.super_QFlagsStorage<QLocalServer::SocketOption>.i =
       (QFlagsStorage<QLocalServer::SocketOption>)
       anon_unknown.dwarf_97e7b5::optionsForPlatform((SocketOptions)in_stack_fffffffffffffc28.i);
  bVar1 = QFlags<QLocalServer::SocketOption>::testFlag
                    ((QFlags<QLocalServer::SocketOption> *)in_stack_fffffffffffffc30,
                     in_stack_fffffffffffffc2c);
  if (bVar1) {
LAB_003848c2:
    QString::operator=(&this->fullServerName,(QString *)CONCAT44(in_register_00000034,__fd));
  }
  else {
    QChar::QChar<char16_t,_true>(&local_b2,L'/');
    uVar6 = QString::startsWith((QChar)(char16_t)__fd,(uint)(ushort)local_b2.ucs);
    if ((uVar6 & 1) != 0) goto LAB_003848c2;
    QDir::tempPath();
    QDir::cleanPath((QString *)local_d0);
    QString::operator=((QString *)in_stack_fffffffffffffc30,
                       (QString *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28.i));
    QString::~QString((QString *)0x384928);
    QString::~QString((QString *)0x384935);
    local_fa = 0x2f;
    QVar10 = ::operator+((char16_t *)in_stack_fffffffffffffc30,
                         (QString *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28.i))
    ;
    local_f0 = QVar10.b;
    local_f8 = QVar10.a;
    ::operator+=((QString *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  QString::operator=(&this->serverName,(QString *)CONCAT44(in_register_00000034,__fd));
  local_118.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_118.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_118.d.size = -0x5555555555555556;
  QByteArray::QByteArray((QByteArray *)0x3849d0);
  local_130.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_130.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_130.d.size = -0x5555555555555556;
  QFile::encodeName((QString *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28.i));
  local_88 = 0xaaaaaaaaaaaaaaaa;
  local_80 = 0xaaaaaaaaaaaaaaaa;
  std::optional<QTemporaryDir>::optional((optional<QTemporaryDir> *)0x384a41);
  local_134.super_QFlagsStorage<QLocalServer::SocketOption>.i =
       (QFlagsStorage<QLocalServer::SocketOption>)
       QFlags<QLocalServer::SocketOption>::operator&
                 ((QFlags<QLocalServer::SocketOption> *)in_stack_fffffffffffffc30,
                  in_stack_fffffffffffffc2c);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_134);
  if (IVar2 != 0) {
    local_140 = 0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_140,(QString *)&this->fullServerName);
    QFileInfo::absolutePath();
    local_15a = 0x2f;
    ::operator+(in_stack_fffffffffffffc38,(char16_t *)in_stack_fffffffffffffc30);
    std::optional<QTemporaryDir>::emplace<QStringBuilder<QString,char16_t>>
              ((optional<QTemporaryDir> *)in_stack_fffffffffffffc30,
               (QStringBuilder<QString,_char16_t> *)
               CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28.i));
    QStringBuilder<QString,_char16_t>::~QStringBuilder
              ((QStringBuilder<QString,_char16_t> *)0x384af6);
    QString::~QString((QString *)0x384b03);
    std::optional<QTemporaryDir>::operator->((optional<QTemporaryDir> *)0x384b10);
    uVar6 = QTemporaryDir::isValid();
    bVar1 = (uVar6 & 1) != 0;
    if (bVar1) {
      std::optional<QTemporaryDir>::operator->((optional<QTemporaryDir> *)0x384b9e);
      QTemporaryDir::path();
      local_1f8 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
      ::operator+(in_stack_fffffffffffffc38,(QLatin1String *)in_stack_fffffffffffffc30);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString,_QLatin1String> *)
                 CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28.i));
      QFile::encodeName((QString *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28.i));
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffc30,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28.i));
      QByteArray::~QByteArray((QByteArray *)0x384c38);
      QString::~QString((QString *)0x384c45);
      QStringBuilder<QString,_QLatin1String>::~QStringBuilder
                ((QStringBuilder<QString,_QLatin1String> *)0x384c52);
      QString::~QString((QString *)0x384c5f);
    }
    else {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
      latin1.m_data = in_stack_fffffffffffffc68;
      latin1.m_size = (qsizetype)in_stack_fffffffffffffc60;
      QString::QString(in_stack_fffffffffffffc40,latin1);
      setError(in_stack_fffffffffffffc60,(QString *)in_stack_fffffffffffffc58);
      QString::~QString((QString *)0x384b79);
      local_2c1 = 0;
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_140);
    if (!bVar1) goto LAB_0038541d;
  }
  iVar3 = qt_safe_socket((int)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                         (int)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                         in_stack_fffffffffffffc28.i);
  this->listenSocket = iVar3;
  if (this->listenSocket == -1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
    latin1_00.m_data = in_stack_fffffffffffffc68;
    latin1_00.m_size = (qsizetype)in_stack_fffffffffffffc60;
    QString::QString(in_stack_fffffffffffffc40,latin1_00);
    setError(in_stack_fffffffffffffc60,(QString *)in_stack_fffffffffffffc58);
    QString::~QString((QString *)0x384d09);
    closeServer(in_stack_fffffffffffffc30);
    local_2c1 = 0;
  }
  else {
    memset(local_76,0xaa,0x6e);
    local_76._0_2_ = 1;
    memset(local_76 + 2,0,0x6c);
    qVar7 = QByteArray::size(&local_130);
    if (qVar7 + 2U < 0x6d) {
      local_324 = 0x6e;
      bVar1 = QFlags<QLocalServer::SocketOption>::testFlag
                        ((QFlags<QLocalServer::SocketOption> *)in_stack_fffffffffffffc30,
                         in_stack_fffffffffffffc2c);
      if (bVar1) {
        in_stack_fffffffffffffc60 = (QLocalServerPrivate *)&stack0xffffffffffffff8d;
        in_stack_fffffffffffffc68 = QByteArray::constData((QByteArray *)0x384e51);
        qVar7 = QByteArray::size(&local_130);
        memcpy(in_stack_fffffffffffffc60,in_stack_fffffffffffffc68,qVar7 + 1);
        qVar7 = QByteArray::size(&local_130);
        local_324 = (int)qVar7 + 3;
      }
      else {
        local_22c.super_QFlagsStorage<QLocalServer::SocketOption>.i =
             (QFlagsStorage<QLocalServer::SocketOption>)
             QFlags<QLocalServer::SocketOption>::operator&
                       ((QFlags<QLocalServer::SocketOption> *)in_stack_fffffffffffffc30,
                        in_stack_fffffffffffffc2c);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_22c);
        if (IVar2 == 0) {
          in_stack_fffffffffffffc40 = (QString *)(local_76 + 2);
          pcVar9 = QByteArray::constData((QByteArray *)0x384fcc);
          qVar7 = QByteArray::size(&local_130);
          memcpy(in_stack_fffffffffffffc40,pcVar9,qVar7 + 1);
        }
        else {
          qVar7 = QByteArray::size(&local_118);
          if (0x6c < qVar7 + 1U) {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
            latin1_02.m_data = in_stack_fffffffffffffc68;
            latin1_02.m_size = (qsizetype)in_stack_fffffffffffffc60;
            QString::QString(in_stack_fffffffffffffc40,latin1_02);
            setError(in_stack_fffffffffffffc60,(QString *)in_stack_fffffffffffffc58);
            QString::~QString((QString *)0x384f44);
            closeServer(in_stack_fffffffffffffc30);
            local_2c1 = 0;
            goto LAB_0038541d;
          }
          in_stack_fffffffffffffc58 =
               (QStringBuilder<char16_t,_const_QString_&> *)
               QByteArray::constData((QByteArray *)0x384f84);
          qVar7 = QByteArray::size(&local_118);
          memcpy(local_76 + 2,in_stack_fffffffffffffc58,qVar7 + 1);
        }
      }
      iVar3 = bind(this->listenSocket,(sockaddr *)local_76,local_324);
      if (iVar3 == -1) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
        latin1_03.m_data = in_stack_fffffffffffffc68;
        latin1_03.m_size = (qsizetype)in_stack_fffffffffffffc60;
        QString::QString(in_stack_fffffffffffffc40,latin1_03);
        setError(in_stack_fffffffffffffc60,(QString *)in_stack_fffffffffffffc58);
        QString::~QString((QString *)0x38507e);
        piVar8 = __errno_location();
        if (*piVar8 == 0x62) {
          qt_safe_close((int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
        }
        else {
          closeServer(in_stack_fffffffffffffc30);
        }
        this->listenSocket = -1;
        local_2c1 = 0;
      }
      else {
        iVar3 = qt_safe_listen(0,0x3850d8);
        if (iVar3 == -1) {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
          latin1_04.m_data = in_stack_fffffffffffffc68;
          latin1_04.m_size = (qsizetype)in_stack_fffffffffffffc60;
          QString::QString(in_stack_fffffffffffffc40,latin1_04);
          setError(in_stack_fffffffffffffc60,(QString *)in_stack_fffffffffffffc58);
          QString::~QString((QString *)0x385140);
          closeServer(in_stack_fffffffffffffc30);
          local_2c1 = 0;
        }
        else {
          local_27c.super_QFlagsStorage<QLocalServer::SocketOption>.i =
               (QFlagsStorage<QLocalServer::SocketOption>)
               QFlags<QLocalServer::SocketOption>::operator&
                         ((QFlags<QLocalServer::SocketOption> *)in_stack_fffffffffffffc30,
                          in_stack_fffffffffffffc2c);
          IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_27c);
          if (IVar2 != 0) {
            local_35c = 0;
            local_280.super_QFlagsStorage<QLocalServer::SocketOption>.i =
                 (QFlagsStorage<QLocalServer::SocketOption>)
                 QFlags<QLocalServer::SocketOption>::operator&
                           ((QFlags<QLocalServer::SocketOption> *)in_stack_fffffffffffffc30,
                            in_stack_fffffffffffffc2c);
            IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_280);
            if (IVar2 != 0) {
              local_35c = 0x1c0;
            }
            local_284.super_QFlagsStorage<QLocalServer::SocketOption>.i =
                 (QFlagsStorage<QLocalServer::SocketOption>)
                 QFlags<QLocalServer::SocketOption>::operator&
                           ((QFlags<QLocalServer::SocketOption> *)in_stack_fffffffffffffc30,
                            in_stack_fffffffffffffc2c);
            IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_284);
            if (IVar2 != 0) {
              local_35c = local_35c | 0x38;
            }
            local_288.super_QFlagsStorage<QLocalServer::SocketOption>.i =
                 (QFlagsStorage<QLocalServer::SocketOption>)
                 QFlags<QLocalServer::SocketOption>::operator&
                           ((QFlags<QLocalServer::SocketOption> *)in_stack_fffffffffffffc30,
                            in_stack_fffffffffffffc2c);
            IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_288);
            if (IVar2 != 0) {
              local_35c = local_35c | 7;
            }
            pcVar9 = QByteArray::constData((QByteArray *)0x38524a);
            iVar3 = chmod(pcVar9,local_35c);
            if (iVar3 == -1) {
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
              latin1_05.m_data = in_stack_fffffffffffffc68;
              latin1_05.m_size = (qsizetype)in_stack_fffffffffffffc60;
              QString::QString(in_stack_fffffffffffffc40,latin1_05);
              setError(in_stack_fffffffffffffc60,(QString *)in_stack_fffffffffffffc58);
              QString::~QString((QString *)0x3852ac);
              closeServer(in_stack_fffffffffffffc30);
              local_2c1 = 0;
              goto LAB_0038541d;
            }
            pcVar9 = QByteArray::constData((QByteArray *)0x3852db);
            __new = QByteArray::constData((QByteArray *)0x3852ed);
            iVar3 = rename(pcVar9,__new);
            if (iVar3 == -1) {
              Qt::Literals::StringLiterals::operator____L1(pcVar9,(size_t)in_stack_fffffffffffffc30)
              ;
              latin1_06.m_data = in_stack_fffffffffffffc68;
              latin1_06.m_size = (qsizetype)in_stack_fffffffffffffc60;
              QString::QString(in_stack_fffffffffffffc40,latin1_06);
              setError(in_stack_fffffffffffffc60,(QString *)in_stack_fffffffffffffc58);
              QString::~QString((QString *)0x385350);
              closeServer(in_stack_fffffffffffffc30);
              local_2c1 = 0;
              goto LAB_0038541d;
            }
          }
          this_00 = (QSocketNotifier *)operator_new(0x10);
          QSocketNotifier::QSocketNotifier(this_00,(long)this->listenSocket,Read,pQVar4);
          this->socketNotifier = this_00;
          QObject::connect((QObject *)local_2c0,(char *)this->socketNotifier,
                           (QObject *)"2activated(QSocketDescriptor)",(char *)pQVar4,0x3ea361);
          QMetaObject::Connection::~Connection(local_2c0);
          QSocketNotifier::setEnabled(SUB81(this->socketNotifier,0));
          local_2c1 = 1;
        }
      }
    }
    else {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
      latin1_01.m_data = in_stack_fffffffffffffc68;
      latin1_01.m_size = (qsizetype)in_stack_fffffffffffffc60;
      QString::QString(in_stack_fffffffffffffc40,latin1_01);
      setError(in_stack_fffffffffffffc60,(QString *)in_stack_fffffffffffffc58);
      QString::~QString((QString *)0x384dea);
      closeServer(in_stack_fffffffffffffc30);
      local_2c1 = 0;
    }
  }
LAB_0038541d:
  std::optional<QTemporaryDir>::~optional((optional<QTemporaryDir> *)0x38542a);
  QByteArray::~QByteArray((QByteArray *)0x385437);
  QByteArray::~QByteArray((QByteArray *)0x385444);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_2c1) & 0xffffff01;
}

Assistant:

bool QLocalServerPrivate::listen(const QString &requestedServerName)
{
    Q_Q(QLocalServer);

    // socket options adjusted for current platform
    auto options = optionsForPlatform(socketOptions.value());

    // determine the full server path
    if (options.testFlag(QLocalServer::AbstractNamespaceOption)
        ||  requestedServerName.startsWith(u'/')) {
        fullServerName = requestedServerName;
    } else {
        fullServerName = QDir::cleanPath(QDir::tempPath());
        fullServerName += u'/' + requestedServerName;
    }
    serverName = requestedServerName;

    QByteArray encodedTempPath;
    const QByteArray encodedFullServerName = QFile::encodeName(fullServerName);
    std::optional<QTemporaryDir> tempDir;

    if (options & QLocalServer::WorldAccessOption) {
        QFileInfo serverNameFileInfo(fullServerName);
        tempDir.emplace(serverNameFileInfo.absolutePath() + u'/');
        if (!tempDir->isValid()) {
            setError("QLocalServer::listen"_L1);
            return false;
        }
        encodedTempPath = QFile::encodeName(tempDir->path() + "/s"_L1);
    }

    // create the unix socket
    listenSocket = qt_safe_socket(PF_UNIX, SOCK_STREAM, 0);
    if (-1 == listenSocket) {
        setError("QLocalServer::listen"_L1);
        closeServer();
        return false;
    }

    // Construct the unix address
    struct ::sockaddr_un addr;

    addr.sun_family = PF_UNIX;
    ::memset(addr.sun_path, 0, sizeof(addr.sun_path));

    // for abstract namespace add 2 to length, to take into account trailing AND leading null
    constexpr unsigned int extraCharacters = PlatformSupportsAbstractNamespace ? 2 : 1;

    if (sizeof(addr.sun_path) < static_cast<size_t>(encodedFullServerName.size() + extraCharacters)) {
        setError("QLocalServer::listen"_L1);
        closeServer();
        return false;
    }

    QT_SOCKLEN_T addrSize = sizeof(::sockaddr_un);
    if (options.testFlag(QLocalServer::AbstractNamespaceOption)) {
        // Abstract socket address is distinguished by the fact
        // that sun_path[0] is a null byte ('\0')
        ::memcpy(addr.sun_path + 1, encodedFullServerName.constData(),
                 encodedFullServerName.size() + 1);
        addrSize = offsetof(::sockaddr_un, sun_path) + encodedFullServerName.size() + 1;
    } else if (options & QLocalServer::WorldAccessOption) {
        if (sizeof(addr.sun_path) < static_cast<size_t>(encodedTempPath.size() + 1)) {
            setError("QLocalServer::listen"_L1);
            closeServer();
            return false;
        }
        ::memcpy(addr.sun_path, encodedTempPath.constData(),
                 encodedTempPath.size() + 1);
    } else {
        ::memcpy(addr.sun_path, encodedFullServerName.constData(),
                 encodedFullServerName.size() + 1);
    }

    // bind
    if (-1 == QT_SOCKET_BIND(listenSocket, (sockaddr *)&addr, addrSize)) {
        setError("QLocalServer::listen"_L1);
        // if address is in use already, just close the socket, but do not delete the file
        if (errno == EADDRINUSE)
            QT_CLOSE(listenSocket);
        // otherwise, close the socket and delete the file
        else
            closeServer();
        listenSocket = -1;
        return false;
    }

    // listen for connections
    if (-1 == qt_safe_listen(listenSocket, listenBacklog)) {
        setError("QLocalServer::listen"_L1);
        closeServer();
        return false;
    }

    if (options & QLocalServer::WorldAccessOption) {
        mode_t mode = 000;

        if (options & QLocalServer::UserAccessOption)
            mode |= S_IRWXU;

        if (options & QLocalServer::GroupAccessOption)
            mode |= S_IRWXG;

        if (options & QLocalServer::OtherAccessOption)
            mode |= S_IRWXO;

        if (::chmod(encodedTempPath.constData(), mode) == -1) {
            setError("QLocalServer::listen"_L1);
            closeServer();
            return false;
        }

        if (::rename(encodedTempPath.constData(), encodedFullServerName.constData()) == -1) {
            setError("QLocalServer::listen"_L1);
            closeServer();
            return false;
        }
    }

    Q_ASSERT(!socketNotifier);
    socketNotifier = new QSocketNotifier(listenSocket,
                                         QSocketNotifier::Read, q);
    q->connect(socketNotifier, SIGNAL(activated(QSocketDescriptor)),
               q, SLOT(_q_onNewConnection()));
    socketNotifier->setEnabled(maxPendingConnections > 0);
    return true;
}